

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O2

void evaluate(Benchmarks *bench,Arguments *args)

{
  int iVar1;
  bench_t bVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  if (0 < args->count) {
    bVar2 = now();
    dVar11 = (((double)CONCAT44(0x45300000,(int)(bench->sum >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)bench->sum) - 4503599627370496.0)) /
             (double)args->count;
    lVar4 = bVar2 - bench->total_start;
    uVar3 = bench->squared_sum / (ulong)(long)args->count;
    auVar6._8_4_ = (int)(uVar3 >> 0x20);
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = 0x45300000;
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) - dVar11 * dVar11;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    iVar1 = args->count;
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    dVar10 = (auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    puts("\n============ RESULTS ================");
    printf("Message size:       %d\n",(ulong)(uint)args->size);
    printf("Message count:      %d\n",(ulong)(uint)args->count);
    printf("Total duration:     %.3f\tms\n",dVar10 / 1000000.0);
    printf("Average duration:   %.3f\tus\n",dVar11 / 1000.0);
    auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)bench->minimum);
    auVar8._8_4_ = (int)(bench->minimum >> 0x20);
    auVar8._12_4_ = 0x45300000;
    printf("Minimum duration:   %.3f\tus\n",
           ((auVar8._8_8_ - 1.9342813113834067e+25) + (auVar8._0_8_ - 4503599627370496.0)) / 1000.0)
    ;
    auVar9._0_8_ = (double)CONCAT44(0x43300000,(int)bench->maximum);
    auVar9._8_4_ = (int)(bench->maximum >> 0x20);
    auVar9._12_4_ = 0x45300000;
    printf("Maximum duration:   %.3f\tus\n",
           ((auVar9._8_8_ - 1.9342813113834067e+25) + (auVar9._0_8_ - 4503599627370496.0)) / 1000.0)
    ;
    printf("Standard deviation: %.3f\tus\n",dVar5 / 1000.0);
    printf("Message rate:       %d\tmsg/s\n",
           (ulong)(uint)(int)((double)iVar1 / (dVar10 / 1000000000.0)));
    puts("=====================================");
    return;
  }
  __assert_fail("args->count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]ipc-bench/source/common/benchmarks.c"
                ,0x2f,"void evaluate(Benchmarks *, Arguments *)");
}

Assistant:

void evaluate(Benchmarks* bench, Arguments* args) {
	assert(args->count > 0);
	const bench_t total_time = now() - bench->total_start;
	const double average = ((double)bench->sum) / args->count;

	double sigma = bench->squared_sum / args->count;
	sigma = sqrt(sigma - (average * average));

	int messageRate = (int)(args->count / (total_time / 1e9));

	printf("\n============ RESULTS ================\n");
	printf("Message size:       %d\n", args->size);
	printf("Message count:      %d\n", args->count);
	printf("Total duration:     %.3f\tms\n", total_time / 1e6);
	printf("Average duration:   %.3f\tus\n", average / 1000.0);
	printf("Minimum duration:   %.3f\tus\n", bench->minimum / 1000.0);
	printf("Maximum duration:   %.3f\tus\n", bench->maximum / 1000.0);
	printf("Standard deviation: %.3f\tus\n", sigma / 1000.0);
	printf("Message rate:       %d\tmsg/s\n", messageRate);
	printf("=====================================\n");
}